

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

bool IsArgumentVariable(FunctionData *function,VariableData *data)

{
  VariableHandle *pVVar1;
  
  pVVar1 = (function->argumentVariables).head;
  do {
    if (pVVar1 == (VariableHandle *)0x0) {
LAB_0028cdea:
      return function->contextArgument == data;
    }
    if (pVVar1->variable == data) {
      if (pVVar1 != (VariableHandle *)0x0) {
        return true;
      }
      goto LAB_0028cdea;
    }
    pVVar1 = pVVar1->next;
  } while( true );
}

Assistant:

bool IsArgumentVariable(FunctionData *function, VariableData *data)
{
	for(VariableHandle *curr = function->argumentVariables.head; curr; curr = curr->next)
	{
		if(data == curr->variable)
			return true;
	}

	if(data == function->contextArgument)
		return true;

	return false;
}